

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O1

void __thiscall luna::VM::CheckTableType(VM *this,Value *t,Value *k,char *op,char *desc)

{
  long *plVar1;
  RuntimeException *this_00;
  long *plVar2;
  pair<const_char_*,_const_char_*> pVar3;
  pair<const_char_*,_int> pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op_desc;
  allocator local_e1;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  char *local_c0;
  char *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((t->type_ != ValueT_Table) &&
     ((t->type_ != ValueT_UserData ||
      ((((t->field_0).closure_)->upvalues_).
       super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x0)))) {
    pVar3 = GetOperandNameAndScope(this,t);
    local_c0 = pVar3.second;
    local_b8 = pVar3.first;
    pVar4 = GetCurrentInstructionPos(this);
    std::__cxx11::string::string((string *)local_50,op,&local_e1);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
    local_b0 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_b0 == plVar2) {
      local_a0 = *plVar2;
      lStack_98 = plVar1[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar2;
    }
    local_a8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_90 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_90 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_e0 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_e0 == plVar2) {
      local_d0 = *plVar2;
      lStack_c8 = plVar1[3];
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar2;
    }
    local_d8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_e0);
    local_70 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_70 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar2;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_e0 != &local_d0) {
      operator_delete(local_e0);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException
              (this_00,pVar4.first,pVar4.second,t,local_b8,local_c0,(char *)local_70);
    __cxa_throw(this_00,&RuntimeException::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void VM::CheckTableType(const Value *t, const Value *k,
                            const char *op, const char *desc) const
    {
        if (t->type_ == ValueT_Table ||
            (t->type_ == ValueT_UserData && t->user_data_->GetMetatable()))
            return ;

        auto ns = GetOperandNameAndScope(t);
        auto pos = GetCurrentInstructionPos();
        auto key_name = k->type_ == ValueT_String ? k->str_->GetCStr() : "?";
        auto op_desc = std::string(op) + " table key '" + key_name + "' " + desc;

        throw RuntimeException(pos.first, pos.second, t,
                ns.first, ns.second, op_desc.c_str());
    }